

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O0

int bzip2_reader_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int bits_checked;
  ssize_t avail;
  uchar *buffer;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  buffer = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  avail = (ssize_t)__archive_read_filter_ahead(filter,0xe,(ssize_t *)&stack0xffffffffffffffd0);
  if ((void *)avail == (void *)0x0) {
    self_local._4_4_ = 0;
  }
  else {
    iVar1 = memcmp((void *)avail,"BZh",3);
    if (iVar1 == 0) {
      if ((*(byte *)(avail + 3) < 0x31) || (0x39 < *(byte *)(avail + 3))) {
        self_local._4_4_ = 0;
      }
      else {
        iVar1 = memcmp((void *)(avail + 4),"1AY&SY",6);
        if ((iVar1 == 0) || (iVar1 = memcmp((void *)(avail + 4),anon_var_dwarf_8557d,6), iVar1 == 0)
           ) {
          self_local._4_4_ = 0x4d;
        }
        else {
          self_local._4_4_ = 0;
        }
      }
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
bzip2_reader_bid(struct archive_read_filter_bidder *self, struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;

	(void)self; /* UNUSED */

	/* Minimal bzip2 archive is 14 bytes. */
	buffer = __archive_read_filter_ahead(filter, 14, &avail);
	if (buffer == NULL)
		return (0);

	/* First three bytes must be "BZh" */
	bits_checked = 0;
	if (memcmp(buffer, "BZh", 3) != 0)
		return (0);
	bits_checked += 24;

	/* Next follows a compression flag which must be an ASCII digit. */
	if (buffer[3] < '1' || buffer[3] > '9')
		return (0);
	bits_checked += 5;

	/* After BZh[1-9], there must be either a data block
	 * which begins with 0x314159265359 or an end-of-data
	 * marker of 0x177245385090. */
	if (memcmp(buffer + 4, "\x31\x41\x59\x26\x53\x59", 6) == 0)
		bits_checked += 48;
	else if (memcmp(buffer + 4, "\x17\x72\x45\x38\x50\x90", 6) == 0)
		bits_checked += 48;
	else
		return (0);

	return (bits_checked);
}